

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O2

int file_read_fn(spng_ctx *ctx,void *user,void *data,size_t n)

{
  int iVar1;
  size_t sVar2;
  
  sVar2 = fread(data,n,1,(FILE *)user);
  iVar1 = 0;
  if (sVar2 != 1) {
    iVar1 = feof((FILE *)user);
    iVar1 = -1 - (uint)(iVar1 == 0);
  }
  return iVar1;
}

Assistant:

static int file_read_fn(spng_ctx *ctx, void *user, void *data, size_t n)
{
    FILE *file = user;
    (void)ctx;

    if(fread(data, n, 1, file) != 1)
    {
        if(feof(file)) return SPNG_IO_EOF;
        else return SPNG_IO_ERROR;
    }

    return 0;
}